

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::initDeploymentTool(VcprojGenerator *this)

{
  QMakeProject *pQVar1;
  QString string;
  QString string_00;
  QString string_01;
  VCProjectSingleConfig *pVVar2;
  Data *pDVar3;
  qsizetype qVar4;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Data *pDVar8;
  qsizetype qVar9;
  undefined8 uVar10;
  char cVar11;
  char cVar12;
  byte bVar13;
  uint uVar14;
  char16_t *__old_val_3;
  ProStringList *pPVar15;
  ProStringList *pPVar16;
  QString *a;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQVar17;
  QList<ProString> *pQVar18;
  iterator iVar19;
  iterator iVar20;
  iterator this_00;
  iterator iVar21;
  longlong __old_val_4;
  QTypedArrayData<char16_t> *__old_val_2;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQVar22;
  longlong __old_val_18;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQVar23;
  QChar QVar24;
  int iVar25;
  longlong __old_val_7;
  long lVar26;
  ProString *dllPath;
  ProString *pPVar27;
  char16_t *__old_val_1;
  long in_FS_OFFSET;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QByteArrayView QVar32;
  QStringView QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QLatin1String QVar38;
  QFileInfo info;
  QDirListing dirList;
  QFileInfo info_1;
  QFileInfo info2;
  VcprojGenerator *pVVar39;
  VcprojGenerator *pVVar40;
  byte in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd19;
  QString local_2b8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  local_298;
  DirEntry local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_230;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQStack_228;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_220;
  undefined1 local_218 [32];
  undefined1 local_1f8 [64];
  undefined1 local_1b8 [64];
  QArrayDataPointer<ProString> local_178;
  QArrayDataPointer<ProString> local_158;
  QArrayDataPointer<ProString> local_138;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_118;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQStack_110;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_108;
  undefined1 local_f8 [32];
  undefined1 local_d8 [48];
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_a8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQStack_a0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_98;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_90;
  QString *local_88;
  qsizetype local_80;
  char *local_78;
  qsizetype local_70;
  char *local_68;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8._0_8_ = (QArrayData *)0x0;
  local_f8._8_8_ = (char16_t *)0x0;
  local_f8._16_8_ = 0;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_d8,"deploy.path");
  pPVar15 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8);
  ProStringList::join((QString *)&local_298,pPVar15,(QChar)0x20);
  uVar7 = local_f8._8_8_;
  uVar6 = local_f8._0_8_;
  qVar4 = local_298.a.a.a.a.a.d.size;
  pDVar3 = local_298.a.a.a.a.a.d.d;
  local_298.a.a.a.a.a.d.d = (Data *)local_f8._0_8_;
  local_f8._0_8_ = pDVar3;
  local_f8._8_8_ = local_298.a.a.a.a.a.d.ptr;
  local_298.a.a.a.a.a.d.ptr = (char16_t *)uVar7;
  local_298.a.a.a.a.a.d.size = local_f8._16_8_;
  local_f8._16_8_ = qVar4;
  if ((QArrayData *)uVar6 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
    }
  }
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_d8._0_8_ !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)local_d8._0_8_)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)local_d8._0_8_)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
    }
  }
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_f8._16_8_ ==
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    QVar37.m_data = (storage_type *)0x16;
    QVar37.m_size = (qsizetype)local_d8;
    QString::fromUtf8(QVar37);
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_1b8,"TARGET");
    QMakeEvaluator::first((ProString *)&local_298,&pQVar1->super_QMakeEvaluator,(ProKey *)local_1b8)
    ;
    ProString::ProString((ProString *)(local_d8 + 0x18),(ProString *)&local_298);
    QStringBuilder<QString,_ProString>::convertTo<QString>
              ((QString *)local_1f8,(QStringBuilder<QString,_ProString> *)local_d8);
    uVar10 = local_f8._0_8_;
    uVar7 = local_1f8._16_8_;
    uVar6 = local_1f8._0_8_;
    local_1f8._0_8_ = local_f8._0_8_;
    local_f8._0_8_ = uVar6;
    local_1f8._8_8_ = local_f8._8_8_;
    local_1f8._16_8_ = local_f8._16_8_;
    local_f8._16_8_ = uVar7;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)uVar10 !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)uVar10)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)uVar10)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)uVar10)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
      }
    }
    QStringBuilder<QString,_ProString>::~QStringBuilder
              ((QStringBuilder<QString,_ProString> *)local_d8);
    if (&(local_298.a.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_298.a.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_298.a.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_298.a.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_298.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_1b8._0_8_ !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)local_1b8._0_8_)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)local_1b8._0_8_)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_1b8._0_8_)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
      }
    }
  }
  QVar28.m_data = (storage_type *)0x1;
  QVar28.m_size = (qsizetype)local_d8;
  QString::fromUtf8(QVar28);
  local_298.a.a.a.a.a.d.d = (Data *)local_d8._0_8_;
  local_298.a.a.a.a.a.d.ptr = (char16_t *)local_d8._8_8_;
  local_298.a.a.a.a.a.d.size = local_d8._16_8_;
  cVar11 = QString::endsWith((QString *)local_f8,(CaseSensitivity)&local_298);
  cVar12 = '\x01';
  if (cVar11 == '\0') {
    QVar29.m_data = (storage_type *)0x1;
    QVar29.m_size = (qsizetype)local_d8;
    QString::fromUtf8(QVar29);
    local_118 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_d8._0_8_;
    pQStack_110 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)local_d8._8_8_;
    local_108 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_d8._16_8_;
    cVar12 = QString::endsWith((QString *)local_f8,(CaseSensitivity)&local_118);
    if (local_118 !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(local_118->a).a.a.a.a.d.d = *(int *)&(local_118->a).a.a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(local_118->a).a.a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_118,2,0x10);
      }
    }
  }
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_298.a.a.a.a.a.d.d !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate(&(local_298.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (cVar12 != '\0') {
    QString::chop((longlong)local_f8);
  }
  pVVar39 = this;
  QString::operator=(&(this->vcProject).Configuration.deployment.RemoteDirectory,(QString *)local_f8
                    );
  local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_d8,"QMAKE_DLL_PATHS");
  pPVar15 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8);
  local_138.d = (pPVar15->super_QList<ProString>).d.d;
  local_138.ptr = (pPVar15->super_QList<ProString>).d.ptr;
  local_138.size = (pPVar15->super_QList<ProString>).d.size;
  if (local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_d8._0_8_ !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)local_d8._0_8_)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)local_d8._0_8_)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
    }
  }
  if (local_138.size != 0) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (pVVar39->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    pVVar40 = pVVar39;
    ProKey::ProKey((ProKey *)local_d8,"LIBS");
    pPVar15 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8);
    pQVar1 = (pVVar39->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_298,"LIBS_PRIVATE");
    pPVar16 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_298);
    local_178.d = (pPVar15->super_QList<ProString>).d.d;
    local_178.ptr = (pPVar15->super_QList<ProString>).d.ptr;
    local_178.size = (pPVar15->super_QList<ProString>).d.size;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_178.d !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)local_178.d)->a).a.a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)local_178.d)->a).a.a.a.a.d.d + 1;
      UNLOCK();
    }
    pPVar27 = (pPVar16->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)(local_1b8 + 0x40),pPVar27,
               pPVar27 + (pPVar16->super_QList<ProString>).d.size);
    pQVar1 = (pVVar40->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_1b8,"QMAKE_LIBS");
    pPVar15 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_1b8);
    local_158.d = local_178.d;
    local_158.ptr = local_178.ptr;
    local_158.size = local_178.size;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_178.d !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)&(local_178.d)->super_QArrayData)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)&(local_178.d)->super_QArrayData)->a).a.a.a.d.d + 1;
      UNLOCK();
    }
    pPVar27 = (pPVar15->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)&local_158,pPVar27,
               pPVar27 + (pPVar15->super_QList<ProString>).d.size);
    pQVar1 = (pVVar40->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_1f8,"QMAKE_LIBS_PRIVATE");
    pPVar15 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_1f8);
    local_58.d = local_158.d;
    local_58.ptr = local_158.ptr;
    local_58.size = local_158.size;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_158.d !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d + 1;
      UNLOCK();
    }
    pPVar27 = (pPVar15->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)&local_58,pPVar27,
               pPVar27 + (pPVar15->super_QList<ProString>).d.size);
    pVVar39 = pVVar40;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_1f8._0_8_ !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)local_1f8._0_8_)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)local_1f8._0_8_)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_1f8._0_8_)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_1f8._0_8_,2,0x10);
        pVVar39 = pVVar40;
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_158);
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_1b8._0_8_ !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)local_1b8._0_8_)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)local_1b8._0_8_)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_1b8._0_8_)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer
              ((QArrayDataPointer<ProString> *)(local_1b8 + 0x40));
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_298.a.a.a.a.a.d.d !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate(&(local_298.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_d8._0_8_ !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)local_d8._0_8_)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)local_d8._0_8_)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
      }
    }
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_58.size !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      a = &(pVVar39->vcProject).Configuration.deployment.AdditionalFiles;
      in_stack_fffffffffffffd18 = 0;
      in_stack_fffffffffffffd19 = 0;
      pQVar23 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_58.ptr;
      do {
        local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_158.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_158.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
        ProString::toQString((QString *)&local_158,(ProString *)pQVar23);
        QString::replace((QChar)(char16_t)&local_158,(QChar)0x5c,0x2f);
        QVar30.m_data = (char *)0x9;
        QVar30.m_size = (qsizetype)&local_158;
        cVar12 = QString::startsWith(QVar30,0x2b0989);
        if (cVar12 == '\0') {
          QVar31.m_data = (char *)0x4;
          QVar31.m_size = (qsizetype)&local_158;
          cVar12 = QString::endsWith(QVar31,0x2b05ef);
          if (cVar12 != '\0') {
            pQVar17 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)(local_158.size + -0x50);
            QVar32.m_data = (storage_type *)0x3;
            QVar32.m_size = (qsizetype)local_d8;
            QString::fromLatin1(QVar32);
            local_298.a.a.a.a.a.d.d = (Data *)local_d8._0_8_;
            local_298.a.a.a.a.a.d.ptr = (char16_t *)local_d8._8_8_;
            local_298.a.a.a.a.a.d.size = local_d8._16_8_;
            QString::replace((longlong)&local_158,(longlong)((long)&(pQVar17->b).d.size + 5),
                             (QString *)0x3);
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_298.a.a.a.a.a.d.d !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate(&(local_298.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          QVar33.m_data = (storage_type_conflict *)local_158.ptr;
          QVar33.m_size = local_158.size;
          QtPrivate::lastIndexOf(QVar33,-1,L'/',CaseSensitive);
          QString::remove((longlong)&local_158,0);
          local_2b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_2b8);
          if (local_138.size != 0) {
            lVar26 = local_138.size * 0x30;
            pPVar27 = local_138.ptr;
            do {
              lVar26 = lVar26 + -0x30;
              local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              ProString::toQString((QString *)local_d8,pPVar27);
              QVar24.ucs = (char16_t)
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
                            *)local_d8;
              cVar12 = QString::endsWith(QVar24,0x2f);
              if (cVar12 == '\0') {
                QString::append(QVar24);
              }
              QString::append((QString *)local_d8);
              QFileInfo::QFileInfo((QFileInfo *)&local_298,(QString *)local_d8);
              pDVar3 = local_2b8.d.d;
              local_2b8.d.d = local_298.a.a.a.a.a.d.d;
              local_298.a.a.a.a.a.d.d = pDVar3;
              QFileInfo::~QFileInfo((QFileInfo *)&local_298);
              bVar13 = QFileInfo::exists();
              if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)local_d8._0_8_ !=
                  (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)0x0) {
                LOCK();
                *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)local_d8._0_8_)->a).a.a.a.d.d =
                     *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                 *)local_d8._0_8_)->a).a.a.a.d.d + -1;
                UNLOCK();
                if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
                  QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                }
              }
              pPVar27 = pPVar27 + 1;
            } while ((bVar13 | lVar26 == 0) != 1);
          }
          cVar12 = QFileInfo::exists();
          if (cVar12 != '\0') {
            QFileInfo::fileName();
            qVar4 = local_178.size;
            pPVar27 = local_178.ptr;
            pDVar8 = local_178.d;
            local_178.d = (Data *)0x0;
            local_178.ptr = (ProString *)0x0;
            local_178.size = 0;
            QFileInfo::absolutePath();
            QDir::toNativeSeparators((QString *)local_218);
            local_a8 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)local_218._16_8_;
            local_d8._40_8_ = local_218._8_8_;
            local_d8._32_8_ = local_218._0_8_;
            local_1f8._24_8_ = "|";
            local_218._0_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_218._8_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_218._16_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1f8._0_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1f8._8_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1f8._16_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1b8._24_8_ = "|";
            local_1f8._32_8_ = (QString *)0x0;
            local_1f8._40_8_ = (char (*) [2])0x0;
            local_1f8._48_8_ = (QString *)0x0;
            local_1b8._56_8_ = "|";
            local_1b8._0_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1b8._8_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1b8._16_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_298.a.a.a.a.b = (char (*) [2])0x2a8369;
            local_1b8._32_8_ = (QString *)0x0;
            local_1b8._40_8_ = (char (*) [2])0x0;
            local_1b8._48_8_ = (QString *)0x0;
            local_298.b.d.d = (Data *)0x2a8369;
            local_298.b.d.ptr = (char16_t *)local_f8;
            local_298.a.a.a.a.a.d.d = (Data *)0x0;
            local_d8._0_8_ = pDVar8;
            local_298.a.a.a.a.a.d.ptr = (char16_t *)0x0;
            local_d8._8_8_ = pPVar27;
            local_298.a.a.a.a.a.d.size = 0;
            local_d8._16_8_ = qVar4;
            local_d8._24_8_ = "|";
            local_298.a.a.a.b = (QString *)0x0;
            local_298.a.a.b = (char (*) [2])0x0;
            local_298.a.b = (QString *)0x0;
            pQStack_a0 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)0x2a8369;
            local_90 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x2b09e1;
            local_98 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)local_298.b.d.ptr;
            ::operator+=(a,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[4]>
                            *)local_d8);
            QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                       local_d8);
            QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                       &local_298);
            QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                       local_1b8);
            QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                       local_1f8);
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_218._0_8_ !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_218._0_8_)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)local_218._0_8_)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)local_218._0_8_)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
              }
            }
            if (local_230 !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(local_230->a).a.a.a.a.d.d = *(int *)&(local_230->a).a.a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(local_230->a).a.a.a.a.d.d == 0) {
                QArrayData::deallocate((QArrayData *)local_230,2,0x10);
              }
            }
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_178.d !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_178.d)->super_QArrayData)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)&(local_178.d)->super_QArrayData)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)&(local_178.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate(&(local_178.d)->super_QArrayData,2,0x10);
              }
            }
            if ((in_stack_fffffffffffffd18 & 1) == 0) {
              local_298.a.a.a.a.a.d.d = (Data *)0x0;
              local_298.a.a.a.a.a.d.ptr = (char16_t *)0x0;
              local_298.a.a.a.a.a.d.size = 0;
              QVar34.m_data = (char *)0x4;
              QVar34.m_size = (qsizetype)&local_158;
              lVar26 = QString::indexOf(QVar34,0x2ac095,CaseInsensitive);
              if (lVar26 == -1) {
                QVar35.m_data = (char *)0x3;
                QVar35.m_size = (qsizetype)&local_158;
                lVar26 = QString::indexOf(QVar35,0x2b09e5,CaseInsensitive);
                if (lVar26 != -1) goto LAB_00243c67;
              }
              else {
                QString::operator=((QString *)&local_298,(QChar)0x64);
LAB_00243c67:
                local_178.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                QFileInfo::QFileInfo((QFileInfo *)(local_1b8 + 0x40));
                if (local_138.size != 0) {
                  lVar26 = local_138.size * 0x30;
                  pPVar27 = local_138.ptr;
                  do {
                    lVar26 = lVar26 + -0x30;
                    local_1b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_1b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_1b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    ProString::toQString((QString *)local_1b8,pPVar27);
                    QVar24.ucs = (char16_t)(QString *)local_1b8;
                    cVar12 = QString::endsWith(QVar24,0x2f);
                    if (cVar12 == '\0') {
                      QString::append(QVar24);
                    }
                    local_d8._0_8_ =
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)0x1d;
                    local_d8._8_8_ = "../plugins/platforms/qwindows";
                    local_d8._16_8_ = &local_298;
                    local_d8._24_8_ =
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)0x4;
                    local_d8._32_8_ = ".dll";
                    ::operator+=((QString *)local_1b8,
                                 (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>
                                  *)local_d8);
                    QFileInfo::QFileInfo((QFileInfo *)local_d8,(QString *)local_1b8);
                    pDVar8 = local_178.d;
                    local_178.d = (Data *)local_d8._0_8_;
                    local_d8._0_8_ = pDVar8;
                    QFileInfo::~QFileInfo((QFileInfo *)local_d8);
                    bVar13 = QFileInfo::exists();
                    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                         *)local_1b8._0_8_ !=
                        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                         *)0x0) {
                      LOCK();
                      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                  *)local_1b8._0_8_)->a).a.a.a.d.d =
                           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                       *)local_1b8._0_8_)->a).a.a.a.d.d + -1;
                      UNLOCK();
                      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                      *)local_1b8._0_8_)->a).a.a.a.d.d == 0) {
                        QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
                      }
                    }
                    pPVar27 = pPVar27 + 1;
                  } while ((bVar13 | lVar26 == 0) != 1);
                }
                cVar12 = QFileInfo::exists();
                if (cVar12 != '\0') {
                  QFileInfo::absolutePath();
                  QDir::toNativeSeparators((QString *)local_1b8);
                  local_98 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                              *)local_1b8._16_8_;
                  pQStack_a0 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                                *)local_1b8._8_8_;
                  local_a8 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                              *)local_1b8._0_8_;
                  local_1b8._16_8_ =
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x0;
                  local_d8._0_8_ = &DAT_00000008;
                  local_d8._8_8_ = "qwindows";
                  local_d8._16_8_ = &local_298;
                  local_d8._24_8_ =
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x4;
                  local_d8._32_8_ = ".dll";
                  local_d8[0x28] = 0x7c;
                  local_1b8._0_8_ =
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x0;
                  local_1b8._8_8_ =
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x0;
                  local_90 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                              *)CONCAT71(local_90._1_7_,0x7c);
                  local_88 = (QString *)local_f8;
                  local_80 = 10;
                  local_78 = "\\platforms";
                  local_70 = 3;
                  local_68 = "|0;";
                  ::operator+=(a,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
                                  *)local_d8);
                  if (local_a8 !=
                      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)0x0) {
                    LOCK();
                    *(int *)&(local_a8->a).a.a.a.a.d.d = *(int *)&(local_a8->a).a.a.a.a.d.d + -1;
                    UNLOCK();
                    if (*(int *)&(local_a8->a).a.a.a.a.d.d == 0) {
                      QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
                    }
                  }
                  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)local_1b8._0_8_ !=
                      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)0x0) {
                    LOCK();
                    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                *)local_1b8._0_8_)->a).a.a.a.d.d =
                         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                     *)local_1b8._0_8_)->a).a.a.a.d.d + -1;
                    UNLOCK();
                    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                    *)local_1b8._0_8_)->a).a.a.a.d.d == 0) {
                      QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
                    }
                  }
                  pQVar17 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                             *)local_1f8._0_8_;
                  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)local_1f8._0_8_ !=
                      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)0x0) {
                    LOCK();
                    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                *)local_1f8._0_8_)->a).a.a.a.d.d =
                         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                     *)local_1f8._0_8_)->a).a.a.a.d.d + -1;
                    UNLOCK();
                    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                    *)local_1f8._0_8_)->a).a.a.a.d.d == 0) {
                      pQVar17 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                                 *)QArrayData::deallocate((QArrayData *)local_1f8._0_8_,2,0x10);
                    }
                  }
                  in_stack_fffffffffffffd19 = (undefined7)((ulong)pQVar17 >> 8);
                  in_stack_fffffffffffffd18 = 1;
                }
                QFileInfo::~QFileInfo((QFileInfo *)(local_1b8 + 0x40));
              }
              if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)local_298.a.a.a.a.a.d.d !=
                  (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)0x0) {
                LOCK();
                *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                     *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                 *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
                UNLOCK();
                if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0)
                {
                  QArrayData::deallocate(&(local_298.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_2b8);
        }
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_158.d !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate(&(local_158.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar23 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)&(pQVar23->a).b;
      } while (pQVar23 !=
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                *)(&((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_58.ptr)->m_string)->a + local_58.size));
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  }
  pQVar1 = (pVVar39->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_d8,"INSTALLS");
  pQVar18 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8)->
             super_QList<ProString>;
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_d8._0_8_ !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)local_d8._0_8_)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)local_d8._0_8_)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
    }
  }
  iVar19 = QList<ProString>::begin(pQVar18);
  iVar20 = QList<ProString>::end(pQVar18);
  if (iVar19.i != iVar20.i) {
    pVVar2 = &pVVar39->vcProject;
    do {
      local_1b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_1b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_1b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (pVVar39->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      local_1f8._8_8_ = ".path";
      local_1f8._0_8_ = iVar19.i;
      ProString::ProString<ProString_const&,char_const(&)[6]>
                ((ProString *)&local_298,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)local_1f8);
      QMakeEvaluator::first
                ((ProString *)local_d8,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_298);
      ProString::toQString((QString *)local_1b8,(ProString *)local_d8);
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_d8._0_8_ !=
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        LOCK();
        *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d =
             *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                         *)local_d8._0_8_)->a).a.a.a.d.d + -1;
        UNLOCK();
        if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
        }
      }
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_298.a.a.a.a.a.d.d !=
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        LOCK();
        *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
             *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                         *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
        UNLOCK();
        if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
          QArrayData::deallocate(&(local_298.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_1b8._16_8_ ==
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        QString::operator=((QString *)local_1b8,(QString *)local_f8);
      }
      uVar14 = *(ushort *)
                &(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_1b8._8_8_)->a).a.a.a.d.d - 0x25;
      if ((0x37 < uVar14) || ((0x80000000000401U >> ((ulong)uVar14 & 0x3f) & 1) == 0)) {
        local_58.d = (Data *)local_f8;
        local_58.ptr = (ProString *)CONCAT71(local_58.ptr._1_7_,0x5c);
        local_58.size = (qsizetype)local_1b8;
        QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&>::convertTo<QString>
                  ((QString *)local_1f8,
                   (QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&> *)&local_58);
        local_d8._0_8_ = local_1f8._0_8_;
        local_d8._8_8_ = local_1f8._8_8_;
        local_d8._16_8_ = local_1f8._16_8_;
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_1f8._0_8_ !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_1f8._0_8_)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)local_1f8._0_8_)->a).a.a.a.d.d + 1;
          UNLOCK();
        }
        string.d.ptr = (char16_t *)iVar19.i;
        string.d.d = (Data *)pVVar39;
        string.d.size._0_1_ = in_stack_fffffffffffffd18;
        string.d.size._1_7_ = in_stack_fffffffffffffd19;
        Option::fixString((QString *)&local_298,string,(uchar)local_d8);
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_d8._0_8_ !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_d8._0_8_)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)local_d8._0_8_)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
          }
        }
        uVar7 = local_1b8._8_8_;
        uVar6 = local_1b8._0_8_;
        qVar4 = local_298.a.a.a.a.a.d.size;
        pDVar3 = local_298.a.a.a.a.a.d.d;
        local_298.a.a.a.a.a.d.d = (Data *)local_1b8._0_8_;
        local_1b8._0_8_ = pDVar3;
        local_1b8._8_8_ = local_298.a.a.a.a.a.d.ptr;
        local_298.a.a.a.a.a.d.ptr = (char16_t *)uVar7;
        local_298.a.a.a.a.a.d.size = local_1b8._16_8_;
        local_1b8._16_8_ = qVar4;
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)uVar6 !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)uVar6)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)uVar6)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)uVar6)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
          }
        }
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_1f8._0_8_ !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_1f8._0_8_)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)local_1f8._0_8_)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_1f8._0_8_)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_1f8._0_8_,2,0x10);
          }
        }
      }
      pQVar1 = (pVVar39->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      local_298.a.a.a.a.a.d.ptr = L".files";
      local_298.a.a.a.a.a.d.d = (Data *)iVar19.i;
      ProString::ProString<ProString_const&,char_const(&)[7]>
                ((ProString *)local_d8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_298);
      pQVar18 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8)->
                 super_QList<ProString>;
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_d8._0_8_ !=
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        LOCK();
        *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d =
             *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                         *)local_d8._0_8_)->a).a.a.a.d.d + -1;
        UNLOCK();
        if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
        }
      }
      this_00 = QList<ProString>::begin(pQVar18);
      iVar21 = QList<ProString>::end(pQVar18);
      in_stack_fffffffffffffd18 = (byte)iVar21.i;
      in_stack_fffffffffffffd19 = (undefined7)((ulong)iVar21.i >> 8);
      if (this_00.i != iVar21.i) {
        do {
          local_1f8._0_8_ = local_1b8._0_8_;
          local_1f8._8_8_ = local_1b8._8_8_;
          local_1f8._16_8_ = local_1b8._16_8_;
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_1b8._0_8_ !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_1b8._0_8_)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)local_1b8._0_8_)->a).a.a.a.d.d + 1;
            UNLOCK();
          }
          local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
          ProString::toQString((QString *)&local_298,this_00.i);
          local_d8._0_8_ = local_298.a.a.a.a.a.d.d;
          local_d8._8_8_ = local_298.a.a.a.a.a.d.ptr;
          local_d8._16_8_ = local_298.a.a.a.a.a.d.size;
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_298.a.a.a.a.a.d.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + 1;
            UNLOCK();
          }
          string_00.d.ptr = (char16_t *)iVar19.i;
          string_00.d.d = (Data *)pVVar39;
          string_00.d.size._0_1_ = in_stack_fffffffffffffd18;
          string_00.d.size._1_7_ = in_stack_fffffffffffffd19;
          Option::fixString((QString *)&local_58,string_00,(uchar)local_d8);
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_d8._0_8_ !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_d8._0_8_)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)local_d8._0_8_)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
            }
          }
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_298.a.a.a.a.a.d.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate(&(local_298.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          local_158.d = (Data *)0x0;
          local_158.ptr = (ProString *)0x0;
          local_158.size = 0;
          local_238 = &DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_238,(QString *)&local_58);
          local_178.d = (Data *)0x0;
          local_178.ptr = (ProString *)0x0;
          local_178.size = 0;
          cVar12 = QFileInfo::isDir();
          if (cVar12 == '\0') {
            QFileInfo::fileName();
            uVar7 = local_d8._16_8_;
            uVar6 = local_d8._0_8_;
            pPVar27 = local_158.ptr;
            pDVar8 = local_158.d;
            local_d8._0_8_ = local_158.d;
            local_158.d = (Data *)uVar6;
            local_158.ptr = (ProString *)local_d8._8_8_;
            local_d8._8_8_ = pPVar27;
            local_d8._16_8_ = local_158.size;
            local_158.size = uVar7;
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)pDVar8 !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&pDVar8->super_QArrayData)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)&pDVar8->super_QArrayData)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)&pDVar8->super_QArrayData)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
              }
            }
            QFileInfo::absolutePath();
          }
          else {
            QVar38.m_data = "*";
            QVar38.m_size = 1;
            QString::operator=((QString *)&local_158,QVar38);
            QFileInfo::fileName();
            local_d8._24_8_ = local_298.a.a.a.a.a.d.size;
            local_d8._16_8_ = local_298.a.a.a.a.a.d.ptr;
            local_d8._8_8_ = local_298.a.a.a.a.a.d.d;
            local_d8._0_8_ = "\\";
            local_298.a.a.a.a.a.d.d = (Data *)0x0;
            local_298.a.a.a.a.a.d.ptr = (char16_t *)0x0;
            local_298.a.a.a.a.a.d.size = 0;
            ::operator+=((QString *)local_1f8,(QStringBuilder<const_char_(&)[2],_QString> *)local_d8
                        );
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_d8._8_8_ !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_d8._8_8_)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)local_d8._8_8_)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)local_d8._8_8_)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate((QArrayData *)local_d8._8_8_,2,0x10);
              }
            }
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_298.a.a.a.a.a.d.d !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate(&(local_298.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
              }
            }
            QFileInfo::absoluteFilePath();
          }
          uVar7 = local_d8._16_8_;
          uVar6 = local_d8._0_8_;
          pPVar27 = local_178.ptr;
          pDVar8 = local_178.d;
          local_d8._0_8_ = local_178.d;
          local_178.d = (Data *)uVar6;
          local_178.ptr = (ProString *)local_d8._8_8_;
          local_d8._8_8_ = pPVar27;
          local_d8._16_8_ = local_178.size;
          local_178.size = uVar7;
          if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
            }
          }
          qVar9 = local_158.size;
          pPVar27 = local_158.ptr;
          pDVar8 = local_158.d;
          qVar4 = local_178.size;
          local_240 = &DAT_aaaaaaaaaaaaaaaa;
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_158.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d + 1;
            UNLOCK();
          }
          local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_d8._8_8_ = QArrayData::allocate((QArrayData **)local_d8,0x18,0x10,1,KeepSize);
          (((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_d8._8_8_)->a).a.a.a.a.d.d = (Data *)pDVar8;
          (((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_d8._8_8_)->a).a.a.a.a.d.ptr = (char16_t *)pPVar27;
          (((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_d8._8_8_)->a).a.a.a.a.d.size = qVar9;
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)pDVar8 !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&pDVar8->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&pDVar8->super_QArrayData)->a).a.a.a.d.d + 1;
            UNLOCK();
          }
          local_d8._16_8_ =
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                *)0x1;
          QDirListing::QDirListing
                    ((QDirListing *)&local_240,local_1b8 + 0x40,
                     (QArrayDataPointer<QString> *)local_d8,0x438);
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_d8);
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)pDVar8 !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&pDVar8->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&pDVar8->super_QArrayData)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&pDVar8->super_QArrayData)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
            }
          }
          local_248.dirListPtr = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          for (local_248.dirListPtr = (QDirListingPrivate *)QDirListing::begin();
              local_248.dirListPtr != (QDirListingPrivate *)0x0;
              local_248.dirListPtr = (QDirListingPrivate *)QDirListing::next(local_248)) {
            local_218._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_218._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_218._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QDirListing::DirEntry::absolutePath();
            local_d8._0_8_ = local_298.a.a.a.a.a.d.d;
            local_d8._8_8_ = local_298.a.a.a.a.a.d.ptr;
            local_d8._16_8_ = local_298.a.a.a.a.a.d.size;
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_298.a.a.a.a.a.d.d !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + 1;
              UNLOCK();
            }
            string_01.d.ptr = (char16_t *)iVar19.i;
            string_01.d.d = (Data *)pVVar39;
            string_01.d.size._0_1_ = in_stack_fffffffffffffd18;
            string_01.d.size._1_7_ = in_stack_fffffffffffffd19;
            Option::fixString((QString *)local_218,string_01,(uchar)local_d8);
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_d8._0_8_ !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_d8._0_8_)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)local_d8._0_8_)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
              }
            }
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_298.a.a.a.a.a.d.d !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)&(local_298.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate(&(local_298.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
              }
            }
            iVar25 = (int)local_218._16_8_ - (int)qVar4;
            QDirListing::DirEntry::fileName();
            pQVar5 = local_220;
            pQVar17 = pQStack_228;
            pQVar23 = local_230;
            local_230 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                         *)0x0;
            pQStack_228 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                           *)0x0;
            local_220 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                         *)0x0;
            if (iVar25 == 0) {
              QVar36.m_data = (storage_type *)0x0;
              QVar36.m_size = (qsizetype)local_d8;
              QString::fromLatin1(QVar36);
              local_2b8.d.d = (Data *)local_d8._0_8_;
              local_2b8.d.ptr = (char16_t *)local_d8._8_8_;
              local_2b8.d.size = local_d8._16_8_;
            }
            else {
              pQVar22 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                         *)(long)iVar25;
              if ((ulong)local_218._16_8_ < pQVar22 || local_218._16_8_ - (long)pQVar22 == 0) {
                local_2b8.d.d = (Data *)local_218._0_8_;
                local_2b8.d.ptr = (char16_t *)local_218._8_8_;
                local_2b8.d.size = local_218._16_8_;
                if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                     *)local_218._0_8_ !=
                    (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                     *)0x0) {
                  LOCK();
                  *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)local_218._0_8_)->a).a.a.a.d.d =
                       *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                   *)local_218._0_8_)->a).a.a.a.d.d + 1;
                  UNLOCK();
                }
              }
              else {
                QString::QString(&local_2b8,
                                 (QChar *)((local_218._16_8_ - (long)pQVar22) * 2 + local_218._8_8_)
                                 ,(longlong)pQVar22);
              }
            }
            local_90 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)local_2b8.d.size;
            local_98 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)local_2b8.d.ptr;
            pQStack_a0 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)local_2b8.d.d;
            local_298.a.a.a.a.b = (char (*) [2])0x2a8369;
            local_298.a.a.a.b = (QString *)local_218;
            local_298.a.a.b = (char (*) [2])0x2a8369;
            local_298.a.b = (QString *)local_1f8;
            local_2b8.d.d = (Data *)0x0;
            local_2b8.d.ptr = (char16_t *)0x0;
            local_2b8.d.size = 0;
            local_298.a.a.a.a.a.d.d = (Data *)0x0;
            local_298.a.a.a.a.a.d.ptr = (char16_t *)0x0;
            local_d8._0_8_ = pQVar23;
            local_d8._8_8_ = pQVar17;
            local_298.a.a.a.a.a.d.size = 0;
            local_d8._16_8_ = pQVar5;
            local_d8._24_8_ = "|";
            local_d8._40_8_ = "|";
            local_298.b.d.d = (Data *)0x0;
            local_298.b.d.ptr = (char16_t *)0x0;
            local_298.b.d.size = 0;
            local_88 = (QString *)0x2b09e1;
            local_d8._32_8_ = local_298.a.a.a.b;
            local_a8 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)local_298.a.b;
            ::operator+=(&(pVVar2->Configuration).deployment.AdditionalFiles,
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>,_const_char_(&)[4]>
                          *)local_d8);
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                               *)local_d8);
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
            ::~QStringBuilder(&local_298);
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_2b8.d.d !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_2b8.d.d)->super_QArrayData)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)&(local_2b8.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)&(local_2b8.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_230 !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(local_230->a).a.a.a.a.d.d = *(int *)&(local_230->a).a.a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(local_230->a).a.a.a.a.d.d == 0) {
                QArrayData::deallocate((QArrayData *)local_230,2,0x10);
              }
            }
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_218._0_8_ !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_218._0_8_)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)local_218._0_8_)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)local_218._0_8_)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
              }
            }
          }
          QDirListing::~QDirListing((QDirListing *)&local_240);
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_178.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_178.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_178.d)->super_QArrayData)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&(local_178.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate(&(local_178.d)->super_QArrayData,2,0x10);
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_238);
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_158.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&(local_158.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate(&(local_158.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_58.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_58.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_58.d)->super_QArrayData)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&(local_58.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_1f8._0_8_ !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_1f8._0_8_)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)local_1f8._0_8_)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)local_1f8._0_8_)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_1f8._0_8_,2,0x10);
            }
          }
          this_00.i = this_00.i + 1;
        } while (this_00.i !=
                 (ProString *)CONCAT71(in_stack_fffffffffffffd19,in_stack_fffffffffffffd18));
      }
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_1b8._0_8_ !=
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        LOCK();
        *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_1b8._0_8_)->a).a.a.a.d.d =
             *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                         *)local_1b8._0_8_)->a).a.a.a.d.d + -1;
        UNLOCK();
        if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_1b8._0_8_)->a).a.a.a.d.d == 0) {
          QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
        }
      }
      iVar19.i = (ProString *)
                 &(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                     *)iVar19.i)->a).b;
    } while (iVar19.i != iVar20.i);
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_138);
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_f8._0_8_ !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)local_f8._0_8_)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)local_f8._0_8_)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_f8._0_8_)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initDeploymentTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    QString targetPath;
    targetPath = project->values("deploy.path").join(' ');
    if (targetPath.isEmpty())
        targetPath = QString("%CSIDL_PROGRAM_FILES%\\") + project->first("TARGET");
    if (targetPath.endsWith("/") || targetPath.endsWith("\\"))
        targetPath.chop(1);
    conf.deployment.RemoteDirectory = targetPath;
    const ProStringList dllPaths = project->values("QMAKE_DLL_PATHS");
    // Only deploy Qt libs for shared build
    if (!dllPaths.isEmpty()) {
        // FIXME: This code should actually resolve the libraries from all Qt modules.
        ProStringList arg = project->values("LIBS") + project->values("LIBS_PRIVATE")
                + project->values("QMAKE_LIBS") + project->values("QMAKE_LIBS_PRIVATE");
        bool qpaPluginDeployed = false;
        for (ProStringList::ConstIterator it = arg.constBegin(); it != arg.constEnd(); ++it) {
            QString dllName = (*it).toQString();
            dllName.replace(QLatin1Char('\\'), QLatin1Char('/'));
            // LIBPATH isn't relevant for deployment
            if (dllName.startsWith(QLatin1String("/LIBPATH:")))
                continue;
            // We want to deploy .dlls not .libs
            if (dllName.endsWith(QLatin1String(".lib")))
                dllName.replace(dllName.size() - 3, 3, QLatin1String("dll"));
            // Use only the file name and check in Qt's install path and LIBPATHs to check for existence
            dllName.remove(0, dllName.lastIndexOf(QLatin1Char('/')) + 1);
            QFileInfo info;
            for (const ProString &dllPath : dllPaths) {
                QString absoluteDllFilePath = dllPath.toQString();
                if (!absoluteDllFilePath.endsWith(QLatin1Char('/')))
                    absoluteDllFilePath += QLatin1Char('/');
                absoluteDllFilePath += dllName;
                info = QFileInfo(absoluteDllFilePath);
                if (info.exists())
                    break;
            }

            if (!info.exists())
                continue;

            conf.deployment.AdditionalFiles += info.fileName()
                    + "|" + QDir::toNativeSeparators(info.absolutePath())
                    + "|" + targetPath
                    + "|0;";
            if (!qpaPluginDeployed) {
                QString debugInfix;
                bool foundGuid = dllName.contains(QLatin1String("Guid"));
                if (foundGuid)
                    debugInfix = QLatin1Char('d');

                if (foundGuid || dllName.contains(QLatin1String("Gui"))) {
                    QFileInfo info2;
                    for (const ProString &dllPath : dllPaths) {
                        QString absoluteDllFilePath = dllPath.toQString();
                        if (!absoluteDllFilePath.endsWith(QLatin1Char('/')))
                            absoluteDllFilePath += QLatin1Char('/');
                        absoluteDllFilePath += QLatin1String("../plugins/platforms/qwindows")
                                + debugInfix + QLatin1String(".dll");
                        info2 = QFileInfo(absoluteDllFilePath);
                        if (info2.exists())
                            break;
                    }
                    if (info2.exists()) {
                        conf.deployment.AdditionalFiles += QLatin1String("qwindows") + debugInfix + QLatin1String(".dll")
                                                    + QLatin1Char('|') + QDir::toNativeSeparators(info2.absolutePath())
                                                    + QLatin1Char('|') + targetPath + QLatin1String("\\platforms")
                                                    + QLatin1String("|0;");
                        qpaPluginDeployed = true;
                    }
                }
            }
        }
    }

    for (const ProString &item : project->values("INSTALLS")) {
        // get item.path
        QString devicePath = project->first(ProKey(item + ".path")).toQString();
        if (devicePath.isEmpty())
            devicePath = targetPath;
        // check if item.path is relative (! either /,\ or %)
        if (!(devicePath.at(0) == QLatin1Char('/')
            || devicePath.at(0) == QLatin1Char('\\')
            || devicePath.at(0) == QLatin1Char('%'))) {
            // create output path
            devicePath = Option::fixPathToTargetOS(targetPath + QLatin1Char('\\') + devicePath);
        }
        // foreach d in item.files
        for (const ProString &src : project->values(ProKey(item + ".files"))) {
            QString itemDevicePath = devicePath;
            QString source = Option::normalizePath(src.toQString());
            QString nameFilter;
            QFileInfo info(source);
            QString searchPath;
            if (info.isDir()) {
                nameFilter = QLatin1String("*");
                itemDevicePath += "\\" + info.fileName();
                searchPath = info.absoluteFilePath();
            } else {
                nameFilter = info.fileName();
                searchPath = info.absolutePath();
            }

            int pathSize = searchPath.size();
            using F = QDirListing::IteratorFlag;
            QDirListing dirList(searchPath, QStringList{nameFilter}, F::FilesOnly | F::ResolveSymlinks | F::Recursive);
            // foreach dirIterator-entry in d
            for (const auto &dirEntry : dirList) {
                const QString absoluteItemPath = Option::fixPathToTargetOS(dirEntry.absolutePath());
                // Identify if it is just another subdir
                int diffSize = absoluteItemPath.size() - pathSize;
                // write out rules
                conf.deployment.AdditionalFiles += dirEntry.fileName()
                        + "|" + absoluteItemPath
                        + "|" + itemDevicePath + (diffSize ? (absoluteItemPath.right(diffSize)) : QLatin1String(""))
                        + "|0;";
            }
        }
    }
}